

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

int cimg_library::cimg::strcasecmp(char *__s1,char *__s2)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  
  if (__s1 == (char *)0x0) {
    iVar3 = -(uint)(__s2 != (char *)0x0);
  }
  else {
    sVar4 = strlen(__s1);
    sVar5 = strlen(__s2);
    iVar11 = (int)sVar4;
    iVar6 = (int)sVar5;
    iVar2 = iVar6;
    if (iVar11 < iVar6) {
      iVar2 = iVar11;
    }
    uVar7 = iVar2 + 1;
    iVar3 = 0;
    if (uVar7 != 0) {
      uVar8 = 0;
      iVar3 = 0;
      if (-1 < iVar2) {
        if (iVar6 < iVar11) {
          iVar11 = iVar6;
        }
        uVar8 = 0;
        do {
          cVar1 = __s1[uVar8];
          cVar9 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar9 = cVar1;
          }
          cVar1 = __s2[uVar8];
          cVar10 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar10 = cVar1;
          }
          iVar3 = (int)cVar9 - (int)cVar10;
          if (iVar3 != 0) goto LAB_0011c9ff;
          uVar8 = uVar8 + 1;
        } while (iVar11 + 1 != (int)uVar8);
        uVar8 = (ulong)uVar7;
      }
LAB_0011c9ff:
      if ((uint)uVar8 == uVar7) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

inline int strcasecmp(const char *const str1, const char *const str2) {
      if (!str1) return str2?-1:0;
      const int
        l1 = (int)std::strlen(str1),
        l2 = (int)std::strlen(str2);
      return cimg::strncasecmp(str1,str2,1 + (l1<l2?l1:l2));
    }